

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O3

void __thiscall
perfetto::ConsumerIPCService::FreeBuffers
          (ConsumerIPCService *this,FreeBuffersRequest *param_1,DeferredFreeBuffersResponse *resp)

{
  RemoteConsumer *pRVar1;
  AsyncResult<perfetto::protos::gen::FreeBuffersResponse> local_20;
  
  pRVar1 = GetConsumerForCurrentRequest(this);
  (*((pRVar1->service_endpoint)._M_t.
     super___uniq_ptr_impl<perfetto::ConsumerEndpoint,_std::default_delete<perfetto::ConsumerEndpoint>_>
     ._M_t.
     super__Tuple_impl<0UL,_perfetto::ConsumerEndpoint_*,_std::default_delete<perfetto::ConsumerEndpoint>_>
     .super__Head_base<0UL,_perfetto::ConsumerEndpoint_*,_false>._M_head_impl)->
    _vptr_ConsumerEndpoint[8])();
  ipc::AsyncResult<perfetto::protos::gen::FreeBuffersResponse>::Create();
  ipc::Deferred<perfetto::protos::gen::FreeBuffersResponse>::Resolve(resp,&local_20);
  if (local_20.msg_._M_t.
      super___uniq_ptr_impl<perfetto::protos::gen::FreeBuffersResponse,_std::default_delete<perfetto::protos::gen::FreeBuffersResponse>_>
      ._M_t.
      super__Tuple_impl<0UL,_perfetto::protos::gen::FreeBuffersResponse_*,_std::default_delete<perfetto::protos::gen::FreeBuffersResponse>_>
      .super__Head_base<0UL,_perfetto::protos::gen::FreeBuffersResponse_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<perfetto::protos::gen::FreeBuffersResponse,_std::default_delete<perfetto::protos::gen::FreeBuffersResponse>_>
       )0x0) {
    (**(code **)(*(long *)local_20.msg_._M_t.
                          super___uniq_ptr_impl<perfetto::protos::gen::FreeBuffersResponse,_std::default_delete<perfetto::protos::gen::FreeBuffersResponse>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_perfetto::protos::gen::FreeBuffersResponse_*,_std::default_delete<perfetto::protos::gen::FreeBuffersResponse>_>
                          .
                          super__Head_base<0UL,_perfetto::protos::gen::FreeBuffersResponse_*,_false>
                          ._M_head_impl + 8))();
  }
  return;
}

Assistant:

void ConsumerIPCService::FreeBuffers(const protos::gen::FreeBuffersRequest&,
                                     DeferredFreeBuffersResponse resp) {
  GetConsumerForCurrentRequest()->service_endpoint->FreeBuffers();
  resp.Resolve(ipc::AsyncResult<protos::gen::FreeBuffersResponse>::Create());
}